

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<unsigned_int,3ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<unsigned_int,_3UL> *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 local_55;
  uint local_4d;
  optional<std::array<unsigned_int,_3UL>_> local_48;
  undefined8 local_35;
  uint local_2d;
  double local_28;
  
  if (v == (array<unsigned_int,_3UL> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_value<std::array<unsigned_int,3ul>>(&local_48,this);
    if (local_48.has_value_ == true) {
      local_2d = local_48.contained._8_4_;
      local_35 = local_48.contained._0_8_;
      local_55 = local_48.contained._0_8_;
      local_4d = local_48.contained._8_4_;
    }
    if (local_48.has_value_ != false) goto LAB_004dc6e6;
    t = local_28;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = tinyusdz::value::TimeSamples::get<std::array<unsigned_int,_3UL>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<std::array<unsigned_int,3ul>>(&local_48,this);
    if (local_48.has_value_ == true) {
      local_55 = local_48.contained._0_8_;
      local_4d = local_48.contained._8_4_;
    }
    if (local_48.has_value_ != false) {
LAB_004dc6e6:
      v->_M_elems[2] = local_4d;
      *(undefined8 *)v->_M_elems = local_55;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }